

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * getgeneric(Table *t,TValue *key,int deadok)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  Node *pNVar4;
  
  pNVar4 = mainpositionTV(t,key);
  do {
    bVar2 = (pNVar4->u).key_tt;
    if ((key->tt_ == bVar2) ||
       (((uVar3 = 0, (key->tt_ & 0x40) != 0 && (deadok != 0)) && (bVar2 == 0xb)))) {
      uVar3 = 1;
      if (bVar2 < 0x11) {
        if (1 < bVar2) {
LAB_0011b15f:
          uVar3 = (uint)((key->value_).gc == (pNVar4->u).key_val.gc);
        }
      }
      else if (bVar2 < 0x16) {
        if (bVar2 != 0x11) {
          if (bVar2 != 0x13) goto LAB_0011b15f;
          uVar3 = -(uint)((pNVar4->u).key_val.n == (key->value_).n) & 1;
        }
      }
      else {
        if ((bVar2 == 0x16) || (bVar2 != 0x54)) goto LAB_0011b15f;
        uVar3 = luaS_eqlngstr((TString *)(key->value_).gc,(TString *)(pNVar4->u).key_val.gc);
      }
    }
    if (uVar3 != 0) {
      return (TValue *)pNVar4;
    }
    piVar1 = &(pNVar4->u).next;
    pNVar4 = pNVar4 + *piVar1;
    if ((long)*piVar1 == 0) {
      return &absentkey;
    }
  } while( true );
}

Assistant:

static const TValue *getgeneric (Table *t, const TValue *key, int deadok) {
  Node *n = mainpositionTV(t, key);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (equalkey(key, n, deadok))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return &absentkey;  /* not found */
      n += nx;
    }
  }
}